

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiOldColumns *pIVar1;
  ImGuiOldColumns *v;
  ImGuiID in_ESI;
  long in_RDI;
  ImGuiOldColumns *columns;
  int n;
  ImGuiOldColumns *in_stack_ffffffffffffff50;
  ImGuiOldColumns local_a0;
  int local_18;
  ImGuiID local_14;
  long local_10;
  
  local_18 = 0;
  local_14 = in_ESI;
  local_10 = in_RDI;
  while( true ) {
    if (*(int *)(local_10 + 0x2a0) <= local_18) {
      v = (ImGuiOldColumns *)(local_10 + 0x2a0);
      pIVar1 = &local_a0;
      ImGuiOldColumns::ImGuiOldColumns(in_stack_ffffffffffffff50);
      ImVector<ImGuiOldColumns>::push_back((ImVector<ImGuiOldColumns> *)pIVar1,v);
      ImGuiOldColumns::~ImGuiOldColumns(pIVar1);
      pIVar1 = ImVector<ImGuiOldColumns>::back((ImVector<ImGuiOldColumns> *)(local_10 + 0x2a0));
      pIVar1->ID = local_14;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiOldColumns>::operator[]
                       ((ImVector<ImGuiOldColumns> *)(local_10 + 0x2a0),local_18);
    if (pIVar1->ID == local_14) break;
    local_18 = local_18 + 1;
  }
  pIVar1 = ImVector<ImGuiOldColumns>::operator[]
                     ((ImVector<ImGuiOldColumns> *)(local_10 + 0x2a0),local_18);
  return pIVar1;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}